

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferGenerate::initPrograms
          (IndirectDispatchCaseBufferGenerate *this,SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  pointer pDVar3;
  string computeString;
  ostringstream computeBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  undefined1 local_1d0 [40];
  ostringstream local_1a8 [376];
  
  IndirectDispatchCaseBufferUpload::initPrograms
            (&this->super_IndirectDispatchCaseBufferUpload,programCollection);
  pcVar1 = glu::getGLSLVersionDeclaration
                     ((this->super_IndirectDispatchCaseBufferUpload).m_glslVersion);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std430) buffer Out\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp uint data[];\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"void writeCmd (uint offset, uvec3 numWorkGroups)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tdata[offset+0u] = numWorkGroups.x;\n");
  poVar2 = std::operator<<(poVar2,"\tdata[offset+1u] = numWorkGroups.y;\n");
  poVar2 = std::operator<<(poVar2,"\tdata[offset+2u] = numWorkGroups.z;\n");
  poVar2 = std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  for (pDVar3 = (this->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands.
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar3 != (this->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands.
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar3 = pDVar3 + 1) {
    poVar2 = std::operator<<((ostream *)local_1a8,"\twriteCmd(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"u, uvec3(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"u, ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"u, ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"u));\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_230,"indirect_dispatch_",
                 &(this->super_IndirectDispatchCaseBufferUpload).super_TestCase.super_TestCase.
                  super_TestNode.m_name);
  std::operator+(&local_210,&local_230,"_generate");
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_210);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1d0,&local_1f0);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void IndirectDispatchCaseBufferGenerate::initPrograms (vk::SourceCollections& programCollection) const
{
	IndirectDispatchCaseBufferUpload::initPrograms(programCollection);

	const char* const	versionDecl = glu::getGLSLVersionDeclaration(m_glslVersion);

	std::ostringstream computeBuffer;

	// Header
	computeBuffer
		<< versionDecl << "\n"
		<< "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) buffer Out\n"
		<< "{\n"
		<< "	highp uint data[];\n"
		<< "};\n"
		<< "void writeCmd (uint offset, uvec3 numWorkGroups)\n"
		<< "{\n"
		<< "	data[offset+0u] = numWorkGroups.x;\n"
		<< "	data[offset+1u] = numWorkGroups.y;\n"
		<< "	data[offset+2u] = numWorkGroups.z;\n"
		<< "}\n"
		<< "void main (void)\n"
		<< "{\n";

	// Dispatch commands
	for (DispatchCommandsVec::const_iterator cmdIter = m_dispatchCommands.begin(); cmdIter != m_dispatchCommands.end(); ++cmdIter)
	{
		const deUint32 offs = (deUint32)(cmdIter->m_offset / sizeof(deUint32));
		DE_ASSERT((size_t)offs * sizeof(deUint32) == (size_t)cmdIter->m_offset);

		computeBuffer
			<< "\twriteCmd(" << offs << "u, uvec3("
			<< cmdIter->m_numWorkGroups.x() << "u, "
			<< cmdIter->m_numWorkGroups.y() << "u, "
			<< cmdIter->m_numWorkGroups.z() << "u));\n";
	}

	// Ending
	computeBuffer << "}\n";

	std::string computeString = computeBuffer.str();

	programCollection.glslSources.add("indirect_dispatch_" + m_name + "_generate") << glu::ComputeSource(computeString);
}